

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::MessageFieldGenerator::GenerateInlineAccessorDefinitions
          (MessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"inline const $type$& $classname$::$name$() const {\n");
  PrintHandlingOptionalStaticInitializers
            (variables,*(FileDescriptor **)(this->descriptor_ + 0x20),printer,
             "  return $name$_ != NULL ? *$name$_ : *default_instance_->$name$_;\n",
             "  return $name$_ != NULL ? *$name$_ : *default_instance().$name$_;\n");
  io::Printer::Print(printer,variables,
                     "}\ninline $type$* $classname$::mutable_$name$() {\n  set_has_$name$();\n  if ($name$_ == NULL) $name$_ = new $type$;\n  return $name$_;\n}\ninline $type$* $classname$::release_$name$() {\n  clear_has_$name$();\n  $type$* temp = $name$_;\n  $name$_ = NULL;\n  return temp;\n}\ninline void $classname$::set_allocated_$name$($type$* $name$) {\n  delete $name$_;\n  $name$_ = $name$;\n  if ($name$) {\n    set_has_$name$();\n  } else {\n    clear_has_$name$();\n  }\n}\n"
                    );
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateInlineAccessorDefinitions(io::Printer* printer) const {
  printer->Print(variables_,
    "inline const $type$& $classname$::$name$() const {\n");

  PrintHandlingOptionalStaticInitializers(
    variables_, descriptor_->file(), printer,
    // With static initializers.
    "  return $name$_ != NULL ? *$name$_ : *default_instance_->$name$_;\n",
    // Without.
    "  return $name$_ != NULL ? *$name$_ : *default_instance().$name$_;\n");

  printer->Print(variables_,
    "}\n"
    "inline $type$* $classname$::mutable_$name$() {\n"
    "  set_has_$name$();\n"
    "  if ($name$_ == NULL) $name$_ = new $type$;\n"
    "  return $name$_;\n"
    "}\n"
    "inline $type$* $classname$::release_$name$() {\n"
    "  clear_has_$name$();\n"
    "  $type$* temp = $name$_;\n"
    "  $name$_ = NULL;\n"
    "  return temp;\n"
    "}\n"
    "inline void $classname$::set_allocated_$name$($type$* $name$) {\n"
    "  delete $name$_;\n"
    "  $name$_ = $name$;\n"
    "  if ($name$) {\n"
    "    set_has_$name$();\n"
    "  } else {\n"
    "    clear_has_$name$();\n"
    "  }\n"
    "}\n");
}